

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void print_keterangan(void)

{
  undefined1 *local_1e0 [2];
  undefined1 local_1d0 [16];
  undefined1 *local_1c0 [2];
  undefined1 local_1b0 [16];
  undefined1 *local_1a0 [2];
  undefined1 local_190 [16];
  undefined1 *local_180 [2];
  undefined1 local_170 [16];
  undefined1 *local_160 [2];
  undefined1 local_150 [16];
  undefined1 *local_140 [2];
  undefined1 local_130 [16];
  undefined1 *local_120 [2];
  undefined1 local_110 [16];
  undefined1 *local_100 [2];
  undefined1 local_f0 [16];
  undefined1 *local_e0 [2];
  undefined1 local_d0 [16];
  undefined1 *local_c0 [2];
  undefined1 local_b0 [16];
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  KumpulanKubus::print(kubus,(FrameBuffer *)fb);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"STEI","");
  Font::print(&font,fb,(string *)local_40,0x44c,100,3,(undefined4)Color::WHITE);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"FMIPA","");
  Font::print(&font,fb,(string *)local_60,0x44c,0x78,3,(undefined4)Color::WHITE);
  if (local_60[0] != local_50) {
    operator_delete(local_60[0]);
  }
  local_80[0] = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"FSRD","");
  Font::print(&font,fb,(string *)local_80,0x44c,0x8c,3,(undefined4)Color::WHITE);
  if (local_80[0] != local_70) {
    operator_delete(local_80[0]);
  }
  local_a0[0] = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"SAPPK","");
  Font::print(&font,fb,(string *)local_a0,0x44c,0xa0,3,(undefined4)Color::WHITE);
  if (local_a0[0] != local_90) {
    operator_delete(local_a0[0]);
  }
  local_c0[0] = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"FTTM","");
  Font::print(&font,fb,(string *)local_c0,0x44c,0xb4,3,(undefined4)Color::WHITE);
  if (local_c0[0] != local_b0) {
    operator_delete(local_c0[0]);
  }
  local_e0[0] = local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"SITH","");
  Font::print(&font,fb,(string *)local_e0,0x44c,200,3,(undefined4)Color::WHITE);
  if (local_e0[0] != local_d0) {
    operator_delete(local_e0[0]);
  }
  local_100[0] = local_f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"FTI","");
  Font::print(&font,fb,(string *)local_100,0x44c,0xdc,3,(undefined4)Color::WHITE);
  if (local_100[0] != local_f0) {
    operator_delete(local_100[0]);
  }
  local_120[0] = local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"FITB","");
  Font::print(&font,fb,(string *)local_120,0x44c,0xf0,3,(undefined4)Color::WHITE);
  if (local_120[0] != local_110) {
    operator_delete(local_120[0]);
  }
  local_140[0] = local_130;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"FTMD","");
  Font::print(&font,fb,(string *)local_140,0x44c,0x104,3,(undefined4)Color::WHITE);
  if (local_140[0] != local_130) {
    operator_delete(local_140[0]);
  }
  local_160[0] = local_150;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"FTSL","");
  Font::print(&font,fb,(string *)local_160,0x44c,0x118,3,(undefined4)Color::WHITE);
  if (local_160[0] != local_150) {
    operator_delete(local_160[0]);
  }
  local_180[0] = local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"SF","");
  Font::print(&font,fb,(string *)local_180,0x44c,300,3,(undefined4)Color::WHITE);
  if (local_180[0] != local_170) {
    operator_delete(local_180[0]);
  }
  local_1a0[0] = local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"SBM","");
  Font::print(&font,fb,(string *)local_1a0,0x44c,0x140,3,(undefined4)Color::WHITE);
  if (local_1a0[0] != local_190) {
    operator_delete(local_1a0[0]);
  }
  local_1c0[0] = local_1b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"UMUM","");
  Font::print(&font,fb,(string *)local_1c0,0x44c,0x154,3,(undefined4)Color::WHITE);
  if (local_1c0[0] != local_1b0) {
    operator_delete(local_1c0[0]);
  }
  local_1e0[0] = local_1d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"OTHER","");
  Font::print(&font,fb,(string *)local_1e0,0x44c,0x168,3,(undefined4)Color::WHITE);
  if (local_1e0[0] != local_1d0) {
    operator_delete(local_1e0[0]);
  }
  return;
}

Assistant:

void print_keterangan() {
  kubus->print(fb);
  font.print(fb, "STEI", UJUNG_X2, UJUNG_Y2, FONT_SIZE2, Color::WHITE);
  font.print(fb, "FMIPA", UJUNG_X2, UJUNG_Y2+20, FONT_SIZE2, Color::WHITE);
  font.print(fb, "FSRD", UJUNG_X2, UJUNG_Y2+40, FONT_SIZE2, Color::WHITE);
  font.print(fb, "SAPPK", UJUNG_X2, UJUNG_Y2+60, FONT_SIZE2, Color::WHITE);
  font.print(fb, "FTTM", UJUNG_X2, UJUNG_Y2+80, FONT_SIZE2, Color::WHITE);
  font.print(fb, "SITH", UJUNG_X2, UJUNG_Y2+100, FONT_SIZE2, Color::WHITE);
  font.print(fb, "FTI", UJUNG_X2, UJUNG_Y2+120, FONT_SIZE2, Color::WHITE);
  font.print(fb, "FITB", UJUNG_X2, UJUNG_Y2+140, FONT_SIZE2, Color::WHITE);
  font.print(fb, "FTMD", UJUNG_X2, UJUNG_Y2+160, FONT_SIZE2, Color::WHITE);
  font.print(fb, "FTSL", UJUNG_X2, UJUNG_Y2+180, FONT_SIZE2, Color::WHITE);
  font.print(fb, "SF", UJUNG_X2, UJUNG_Y2+200, FONT_SIZE2, Color::WHITE);
  font.print(fb, "SBM", UJUNG_X2, UJUNG_Y2+220, FONT_SIZE2, Color::WHITE);
  font.print(fb, "UMUM", UJUNG_X2, UJUNG_Y2+240, FONT_SIZE2, Color::WHITE);
  font.print(fb, "OTHER", UJUNG_X2, UJUNG_Y2+260, FONT_SIZE2, Color::WHITE);
}